

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engrave.c
# Opt level: O1

uint nelbereths_at(level *lev,xchar x,xchar y)

{
  engr *peVar1;
  char *pcVar2;
  uint uVar3;
  char *str;
  
  for (peVar1 = lev->lev_engr; peVar1 != (engr *)0x0; peVar1 = peVar1->nxt_engr) {
    if ((peVar1->engr_x == x) && (peVar1->engr_y == y)) goto LAB_0019b626;
  }
  peVar1 = (engr *)0x0;
LAB_0019b626:
  uVar3 = 0;
  if ((peVar1 != (engr *)0x0) && (uVar3 = 0, peVar1->engr_type != '\x06')) {
    str = peVar1->engr_txt;
    pcVar2 = strstri(str,"Elbereth");
    if (pcVar2 != (char *)0x0) {
      uVar3 = 0;
      do {
        str = str + 8;
        uVar3 = uVar3 + 1;
        pcVar2 = strstri(str,"Elbereth");
      } while (pcVar2 != (char *)0x0);
    }
  }
  return uVar3;
}

Assistant:

static unsigned int nelbereths_at(struct level *lev, xchar x, xchar y)
{
	const char *s = "Elbereth";
	size_t s_len = strlen(s);
	struct engr *ep = engr_at(lev, x, y);
	unsigned int count = 0;
	const char *p;

	if (!ep || ep->engr_type == HEADSTONE)
	    return 0;

	p = ep->engr_txt;
	while (strstri(p, s)) {
	    count++;
	    p += s_len;
	}

	return count;
}